

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open.c
# Opt level: O0

FILE * open_file_std(char *fname,char *mode)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  FILE *local_8;
  
  iVar1 = strcmp(in_RDI,"-");
  if (iVar1 == 0) {
    if (*in_RSI == 'r') {
      local_8 = _stdin;
    }
    else {
      if (*in_RSI != 'w') {
        fprintf(_stderr,"Bad mode passed to open_file_std: %s\n",in_RSI);
        exit(1);
      }
      local_8 = _stdout;
    }
  }
  else {
    local_8 = fopen(in_RDI,in_RSI);
  }
  return (FILE *)local_8;
}

Assistant:

FILE *open_file_std
( char *fname,	/* Name of file to open, or "-" for stdin/stdout */
  char *mode	/* Mode for opening: eg, "r" or "w" */
)
{ 
  if (strcmp(fname,"-")==0)
  { switch (mode[0])
    { case 'r': 
      { return stdin;
      }
      case 'w': 
      { return stdout;
      }
      default:  
      { fprintf(stderr,"Bad mode passed to open_file_std: %s\n",mode);
        exit(1);
      }
    }
  }
  else
  { return fopen(fname,mode);
  }
}